

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O0

int nv_ckbios(uint8_t *data,int *length)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int *in_RSI;
  long in_RDI;
  int vbios2_len;
  int vbios_len;
  uint32_t ret;
  uint16_t pcir_ptr2;
  uint16_t pcir_ptr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_20;
  undefined2 in_stack_ffffffffffffffe4;
  uint length_00;
  undefined2 uVar4;
  int local_4;
  
  local_4 = nv_checksignature((uint8_t *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 1) {
    uVar1 = *(ushort *)(in_RDI + 0x18);
    length_00 = CONCAT22(uVar1,in_stack_ffffffffffffffe4);
    iVar2 = (uint)*(byte *)(in_RDI + (int)(uVar1 + 0x10)) * 0x200 +
            (uint)*(byte *)(in_RDI + (int)(uVar1 + 0x11)) * 0x20000;
    local_20 = nv_cksum((uint8_t *)in_RSI,length_00);
    uVar4 = (undefined2)(length_00 >> 0x10);
    if (in_RSI != (int *)0x0) {
      *in_RSI = iVar2;
    }
    if ((*(byte *)(in_RDI + (int)((length_00 >> 0x10) + 0x15)) & 0x80) == 0) {
      fprintf(_stderr,"Card has second bios\n");
      iVar3 = nv_checksignature((uint8_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      if (iVar3 != 1) {
        return iVar3;
      }
      uVar1 = CONCAT11(*(undefined1 *)(in_RDI + (iVar2 + 0x19)),
                       *(undefined1 *)(in_RDI + (iVar2 + 0x18)));
      iVar2 = (uint)*(byte *)(in_RDI + (int)(iVar2 + (uint)uVar1 + 0x10)) * 0x200 +
              (uint)*(byte *)(in_RDI + (int)(iVar2 + (uint)uVar1 + 0x11)) * 0x20000;
      local_20 = nv_cksum((uint8_t *)in_RSI,CONCAT22(uVar4,uVar1));
      if (in_RSI != (int *)0x0) {
        *in_RSI = iVar2 + *in_RSI;
      }
    }
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

static int nv_ckbios(const uint8_t *data, int *length)
{
	uint16_t pcir_ptr, pcir_ptr2;
	uint32_t ret = EUNK;
	int vbios_len, vbios2_len;

	ret = nv_checksignature(data);
	if (ret != EOK)
		return ret;

	pcir_ptr = data[0x18] | data[0x19] << 8;
	vbios_len = data[pcir_ptr + 0x10] * 512 + data[pcir_ptr + 0x11] * 512 * 256;
	ret = nv_cksum(data, vbios_len);
	if (length)
		*length = vbios_len;

	/* Check for a second vbios */
	if (!(data[pcir_ptr + 0x15] & 0x80)) {

		fprintf(stderr, "Card has second bios\n");

		ret = nv_checksignature(data + vbios_len);
		if (ret != EOK)
			return ret;

		pcir_ptr2 = data[vbios_len + 0x18] | data[vbios_len + 0x19] << 8;
		vbios2_len = data[vbios_len + pcir_ptr2 + 0x10] * 512 + data[vbios_len + pcir_ptr2 + 0x11] * 512 * 256;

		ret = nv_cksum(data + vbios_len, vbios2_len);

		if (length)
			*length += vbios2_len;
	}
	return ret;
}